

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall kratos::Param::value_str_abi_cxx11_(string *__return_storage_ptr__,Param *this)

{
  Param *pPVar1;
  Param *p;
  string *psVar2;
  
  if (this->param_type_ == Integral) {
    Const::to_string_abi_cxx11_(__return_storage_ptr__,&this->super_Const);
    return __return_storage_ptr__;
  }
  pPVar1 = this->parent_param_;
  if (pPVar1 != (Param *)0x0) {
    (*(pPVar1->super_Const).super_Var.super_IRNode._vptr_IRNode[0x1f])
              (__return_storage_ptr__,pPVar1);
    return __return_storage_ptr__;
  }
  if (this->param_type_ == RawType) {
    if ((this->raw_str_value_).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      psVar2 = (string *)&this->raw_str_value_;
      goto LAB_00190c51;
    }
    if ((this->initial_raw_str_value_).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      psVar2 = (string *)&this->initial_raw_str_value_;
      goto LAB_00190c51;
    }
  }
  psVar2 = (string *)&(this->super_Const).super_Var.name;
LAB_00190c51:
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Param::value_str() const {
    if (param_type_ == ParamType::Integral) {
        return Const::to_string();
    } else if (parent_param_) {
        const auto *p = parent_param();
        return p->to_string();
    } else {
        // raw type
        if (param_type_ == ParamType::RawType) {
            if (raw_str_value_) return *raw_str_value_;
            if (initial_raw_str_value_) return *initial_raw_str_value_;
        }
        return name;
    }
}